

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_nop_implied_instructions.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::NopImpliedFixture::~NopImpliedFixture(NopImpliedFixture *this)

{
  anon_unknown.dwarf_1b7ec4::NopImpliedFixture::~NopImpliedFixture
            ((NopImpliedFixture *)(this + -0x118));
  return;
}

Assistant:

TEST_P(NopImpliedFixture, nop_implied) {
    stage_instruction(GetParam());

    step_execution(2);
    EXPECT_EQ(expected, registers);
}